

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Jacobi
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  long *plVar1;
  double *pdVar2;
  TPZFMatrix<double> *this;
  double dVar3;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar5;
  double dVar6;
  int ord;
  REAL C_ab;
  REAL B_ab;
  REAL A_ab;
  REAL b;
  REAL a;
  double in_stack_ffffffffffffff40;
  int64_t in_stack_ffffffffffffff48;
  long *row;
  TPZFMatrix<double> *in_stack_ffffffffffffff50;
  double local_80;
  double local_78;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48 [4];
  double local_28;
  long *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  local_28 = JacobiA;
  local_48[3] = JacobiB;
  if (0 < in_EDI) {
    local_48[2] = 1.0;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x100))(in_RSI,0,0,local_48 + 2);
    local_48[1] = 0.0;
    (**(code **)(*local_20 + 0x100))(local_20,0,0,local_48 + 1);
    if (local_c != 1) {
      local_48[0] = ((local_28 + 2.0 + local_48[3]) * local_8 + (local_28 - local_48[3])) * 0.5;
      (**(code **)(*local_18 + 0x100))(local_18,1,0,local_48);
      plVar1 = local_20;
      dVar6 = (double)local_c + local_28 + local_48[3];
      pdVar2 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                          (int64_t)in_stack_ffffffffffffff40);
      local_50 = (dVar6 + 1.0) * 0.5 * *pdVar2;
      (**(code **)(*plVar1 + 0x100))(plVar1,0,1,&local_50);
      for (local_6c = 2; local_6c < local_c; local_6c = local_6c + 1) {
        local_58 = (((double)local_6c + (double)local_6c + local_28 + local_48[3] + 1.0) *
                   ((double)local_6c + (double)local_6c + local_28 + local_48[3] + 2.0)) /
                   ((double)(local_6c + 1) * 2.0 * ((double)local_6c + local_28 + local_48[3] + 1.0)
                   );
        local_60 = ((local_48[3] * local_48[3] + -(local_28 * local_28)) *
                   ((double)local_6c + (double)local_6c + local_28 + local_48[3] + 1.0)) /
                   ((double)(local_6c + 1) * 2.0 * ((double)local_6c + local_28 + local_48[3] + 1.0)
                   * ((double)local_6c + (double)local_6c + local_28 + local_48[3]));
        local_68 = (((double)local_6c + local_28) * ((double)local_6c + local_48[3]) *
                   ((double)local_6c + (double)local_6c + local_28 + local_48[3] + 2.0)) /
                   ((double)(local_6c + 1) * ((double)local_6c + local_28 + local_48[3] + 1.0) *
                   ((double)local_6c + (double)local_6c + local_28 + local_48[3]));
        this = (TPZFMatrix<double> *)(long)local_6c;
        dVar3 = -local_60;
        dVar5 = local_58 * local_8;
        row = local_18;
        pdVar2 = TPZFMatrix<double>::operator()
                           (this,(int64_t)local_18,(int64_t)in_stack_ffffffffffffff40);
        dVar6 = local_68;
        in_stack_ffffffffffffff40 = *pdVar2;
        pdVar2 = TPZFMatrix<double>::operator()
                           (this,(int64_t)row,(int64_t)in_stack_ffffffffffffff40);
        local_78 = (dVar5 + dVar3) * in_stack_ffffffffffffff40 + -(dVar6 * *pdVar2);
        (**(code **)(*row + 0x100))(row,this,0,&local_78);
        plVar1 = local_20;
        lVar4 = (long)local_6c;
        dVar6 = (double)local_6c + local_28 + local_48[3];
        pdVar2 = TPZFMatrix<double>::operator()
                           (this,(int64_t)row,(int64_t)in_stack_ffffffffffffff40);
        local_80 = (dVar6 + 1.0) * 0.5 * *pdVar2;
        (**(code **)(*plVar1 + 0x100))(plVar1,0,lVar4,&local_80);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Jacobi(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		// Quadratic or higher shape functions
        REAL a = JacobiA, b = JacobiB;
		if(num <= 0) return;
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, 0.5 * (a - b + (2.0 + a + b) * x));
		dphi.Put(0,1, 0.5*(num + a + b + 1)*phi(num-1,0) );
        // Following http://mathworld.wolfram.com/JacobiPolynomial.html
        REAL A_ab=0.0, B_ab=0.0, C_ab=0.0;
		for(int ord = 2;ord<num;ord++) {
            //Computing Coefficients for three terms recursion relation
            A_ab = ((2.0*ord+a+b+1)*(2.0*ord+a+b+2))/(2.0*(ord+1)*(ord+a+b+1));
            B_ab = ((b*b-a*a)*(2.0*ord+a+b+1))/(2.0*(ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
            C_ab = ((ord+a)*(ord+b)*(2.0*ord+a+b+2))/((ord+1)*(ord+a+b+1)*(2.0*ord+a+b));
			phi.Put(ord,0, (A_ab*x - B_ab)*phi(ord-1,0) - C_ab*phi(ord-2,0));
			dphi.Put(0,ord, 0.5*(ord + a + b + 1)*phi(ord-1,0));
		}
	}